

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiInputTextState::ClearFreeMemory(ImGuiInputTextState *this)

{
  ImVector<unsigned_short> *in_RDI;
  
  ImVector<unsigned_short>::clear(in_RDI);
  ImVector<char>::clear((ImVector<char> *)in_RDI);
  ImVector<char>::clear((ImVector<char> *)in_RDI);
  return;
}

Assistant:

void        ClearFreeMemory()           { TextW.clear(); TextA.clear(); InitialTextA.clear(); }